

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTMLparser.c
# Opt level: O2

htmlDocPtr htmlCtxtReadFd(htmlParserCtxtPtr ctxt,int fd,char *URL,char *encoding,int options)

{
  xmlParserInputPtr input;
  htmlDocPtr pxVar1;
  
  if (ctxt != (htmlParserCtxtPtr)0x0) {
    htmlCtxtReset(ctxt);
    htmlCtxtUseOptions(ctxt,options);
    input = xmlCtxtNewInputFromFd(ctxt,URL,fd,encoding,0);
    if (input != (xmlParserInputPtr)0x0) {
      pxVar1 = htmlCtxtParseDocument(ctxt,input);
      return pxVar1;
    }
  }
  return (htmlDocPtr)0x0;
}

Assistant:

htmlDocPtr
htmlCtxtReadFd(htmlParserCtxtPtr ctxt, int fd,
              const char *URL, const char *encoding, int options)
{
    xmlParserInputPtr input;

    if (ctxt == NULL)
        return(NULL);

    htmlCtxtReset(ctxt);
    htmlCtxtUseOptions(ctxt, options);

    input = xmlCtxtNewInputFromFd(ctxt, URL, fd, encoding, 0);
    if (input == NULL)
        return(NULL);

    return(htmlCtxtParseDocument(ctxt, input));
}